

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_timestamp(void)

{
  byte bVar1;
  int iVar2;
  int __fd;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  bool bVar6;
  int fd2;
  int fd1;
  int off;
  uint o;
  int unequal;
  uint8_t *expected_data;
  uint8_t *bson_data;
  char *expected_json;
  char *bson_json;
  _Bool r;
  bson_t compare;
  bson_t b;
  bson_error_t error;
  uint local_450;
  uint local_434;
  uint local_430;
  undefined1 local_400 [4];
  uint local_3fc;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_290 [8];
  undefined1 auStack_288 [640];
  
  memset(local_290,0,0x200);
  bson_init(local_400);
  bson_append_timestamp(local_400,"ts",2,0x589e8db9,0x4d2);
  bVar1 = bson_init_from_json(local_380,
                              "{\"ts\": {\"$timestamp\": {\"t\": 1486785977, \"i\": 1234}}}",
                              0xffffffffffffffff,local_290);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s\n",auStack_288);
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0xa59,"test_bson_json_timestamp","r");
    abort();
  }
  __buf = (void *)bson_get_data(local_380);
  __buf_00 = (void *)bson_get_data(local_400);
  local_434 = 0xffffffff;
  bVar6 = true;
  if (local_3fc == local_37c) {
    __s1 = (void *)bson_get_data(local_400);
    __s2 = (void *)bson_get_data(local_380);
    iVar2 = memcmp(__s1,__s2,(ulong)local_3fc);
    bVar6 = iVar2 != 0;
  }
  if (!bVar6) {
    bson_destroy(local_400);
    bson_destroy(local_380);
    return;
  }
  uVar3 = bson_as_canonical_extended_json(local_380,0);
  uVar4 = bson_as_canonical_extended_json(local_400,0);
  local_430 = 0;
  do {
    if (local_37c <= local_430 || local_3fc <= local_430) {
LAB_0012a90d:
      if (local_434 == 0xffffffff) {
        if (local_37c < local_3fc) {
          local_450 = local_3fc;
        }
        else {
          local_450 = local_37c;
        }
        local_434 = local_450 - 1;
      }
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)local_434,uVar3,uVar4);
      iVar2 = open("failure.bad.bson",0x42,0x1a0);
      __fd = open("failure.expected.bson",0x42,0x1a0);
      if (iVar2 == -1) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
                ,0xa5b,"test_bson_json_timestamp","fd1 != -1");
        abort();
      }
      if (__fd == -1) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
                ,0xa5b,"test_bson_json_timestamp","fd2 != -1");
        abort();
      }
      uVar5 = write(iVar2,__buf,(ulong)local_37c);
      if (local_37c == uVar5) {
        uVar5 = write(__fd,__buf_00,(ulong)local_3fc);
        if (local_3fc == uVar5) {
          close(iVar2);
          close(__fd);
          fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
                  ,0xa5b,"test_bson_json_timestamp","0");
          abort();
        }
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
                ,0xa5b,"test_bson_json_timestamp",
                "(&compare)->len == bson_write (fd2, expected_data, (&compare)->len)");
        abort();
      }
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0xa5b,"test_bson_json_timestamp",
              "(&b)->len == bson_write (fd1, bson_data, (&b)->len)");
      abort();
    }
    if (*(char *)((long)__buf + (ulong)local_430) != *(char *)((long)__buf_00 + (ulong)local_430)) {
      local_434 = local_430;
      goto LAB_0012a90d;
    }
    local_430 = local_430 + 1;
  } while( true );
}

Assistant:

static void
test_bson_json_timestamp (void)
{
   bson_error_t error = {0};
   bson_t b, compare;
   bool r;

   bson_init (&compare);

   BSON_APPEND_TIMESTAMP (
      &compare, "ts", (uint32_t) 1486785977, (uint32_t) 1234);

   r = bson_init_from_json (
      &b,
      "{\"ts\": {\"$timestamp\": {\"t\": 1486785977, \"i\": 1234}}}",
      -1,
      &error);

   if (!r) {
      fprintf (stderr, "%s\n", error.message);
   }

   BSON_ASSERT (r);

   bson_eq_bson (&b, &compare);
   bson_destroy (&compare);
   bson_destroy (&b);
}